

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

VaryingInterface *
deqp::gles31::Functional::anon_unknown_0::genVaryingInterface
          (VaryingInterface *__return_storage_ptr__,VaryingParams *params,Random *rnd)

{
  bool bVar1;
  VaryingInterpolation fragmentInterpolation;
  int iVar2;
  Interpolation IVar3;
  BindingKind local_1f4;
  VaryingInterpolation local_1f0;
  DataType local_1e0;
  BindingKind local_1d8;
  Layout local_1bc;
  VariableDeclaration local_1a8;
  Layout local_144;
  VariableDeclaration local_130;
  int local_cc;
  undefined1 local_c8 [8];
  VarType varType;
  string frgName;
  string vtxName;
  string ndxStr;
  int loc;
  VaryingInterpolation vtxCompatInterp;
  VaryingInterpolation frgInterp;
  VaryingInterpolation vtxInterp;
  DataType type;
  int local_2c;
  BindingKind binding;
  int varNdx;
  int offset;
  Random *rnd_local;
  VaryingParams *params_local;
  VaryingInterface *ret;
  
  varNdx._3_1_ = 0;
  _offset = rnd;
  rnd_local = (Random *)params;
  params_local = (VaryingParams *)__return_storage_ptr__;
  VaryingInterface::VaryingInterface(__return_storage_ptr__);
  binding = BINDING_NAME;
  local_2c = 0;
  while( true ) {
    if ((int)(rnd_local->m_rnd).x <= local_2c) {
      return __return_storage_ptr__;
    }
    if ((rnd_local->m_rnd).z == 2) {
      local_1d8 = randomBinding(_offset);
    }
    else {
      local_1d8 = (rnd_local->m_rnd).z;
    }
    if ((rnd_local->m_rnd).y == 0x5e) {
      local_1e0 = randomType(_offset);
    }
    else {
      local_1e0 = (rnd_local->m_rnd).y;
    }
    local_1f0 = chooseInterpolation((rnd_local->m_rnd).w,local_1e0,_offset);
    fragmentInterpolation = chooseInterpolation(rnd_local[1].m_rnd.x,local_1e0,_offset);
    bVar1 = isSSOCompatibleInterpolation(local_1f0,fragmentInterpolation);
    if (!bVar1) {
      local_1f0 = fragmentInterpolation;
    }
    if (local_1d8 == BINDING_LOCATION) {
      local_1f4 = binding;
    }
    else {
      local_1f4 = ~BINDING_NAME;
    }
    de::toString<int>((string *)((long)&vtxName.field_2 + 8),&local_2c);
    if (local_1d8 == BINDING_NAME) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&frgName.field_2 + 8),"var",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vtxName.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&varType.m_data + 8),"var",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vtxName.field_2 + 8));
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&frgName.field_2 + 8),"vtxVar",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vtxName.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&varType.m_data + 8),"frgVar",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vtxName.field_2 + 8));
    }
    glu::VarType::VarType((VarType *)local_c8,local_1e0,PRECISION_HIGHP);
    iVar2 = glu::getDataTypeNumLocations(local_1e0);
    binding = iVar2 + binding;
    if ((int)binding < 0x11) {
      IVar3 = getGluInterpolation(local_1f0);
      glu::Layout::Layout(&local_144,local_1f4,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_130,(VarType *)local_c8,(string *)((long)&frgName.field_2 + 8),STORAGE_OUT,
                 IVar3,&local_144,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&__return_storage_ptr__->vtxOutputs,&local_130);
      glu::VariableDeclaration::~VariableDeclaration(&local_130);
      IVar3 = getGluInterpolation(fragmentInterpolation);
      glu::Layout::Layout(&local_1bc,local_1f4,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_1a8,(VarType *)local_c8,(string *)((long)&varType.m_data + 8),STORAGE_IN,
                 IVar3,&local_1bc,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&__return_storage_ptr__->frgInputs,&local_1a8);
      glu::VariableDeclaration::~VariableDeclaration(&local_1a8);
      local_cc = 0;
    }
    else {
      local_cc = 2;
    }
    glu::VarType::~VarType((VarType *)local_c8);
    std::__cxx11::string::~string((string *)((long)&varType.m_data + 8));
    std::__cxx11::string::~string((string *)(frgName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(vtxName.field_2._M_local_buf + 8));
    if (local_cc != 0) break;
    local_2c = local_2c + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

VaryingInterface genVaryingInterface (const VaryingParams&		params,
									  Random&					rnd)
{
	using namespace	glu;

	VaryingInterface	ret;
	int					offset = 0;

	for (int varNdx = 0; varNdx < params.count; ++varNdx)
	{
		const BindingKind			binding			= ((params.binding == BINDING_LAST)
													   ? randomBinding(rnd) : params.binding);
		const DataType				type			= ((params.type == TYPE_LAST)
													   ? randomType(rnd) : params.type);
		const VaryingInterpolation	vtxInterp		= chooseInterpolation(params.vtxInterp, type, rnd);
		const VaryingInterpolation	frgInterp		= chooseInterpolation(params.frgInterp, type, rnd);
		const VaryingInterpolation	vtxCompatInterp	= (isSSOCompatibleInterpolation(vtxInterp, frgInterp))
													   ? (vtxInterp) : (frgInterp);
		const int					loc				= ((binding == BINDING_LOCATION) ? offset : -1);
		const string				ndxStr			= de::toString(varNdx);
		const string				vtxName			= ((binding == BINDING_NAME)
													   ? "var" + ndxStr : "vtxVar" + ndxStr);
		const string				frgName			= ((binding == BINDING_NAME)
													   ? "var" + ndxStr : "frgVar" + ndxStr);
		const VarType				varType			(type, PRECISION_HIGHP);

		offset += getDataTypeNumLocations(type);

		// Over 16 locations aren't necessarily supported, so halt here.
		if (offset > 16)
			break;

		ret.vtxOutputs.push_back(
			VariableDeclaration(varType, vtxName, STORAGE_OUT, getGluInterpolation(vtxCompatInterp), loc));
		ret.frgInputs.push_back(
			VariableDeclaration(varType, frgName, STORAGE_IN, getGluInterpolation(frgInterp), loc));
	}

	return ret;
}